

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy_toplex_map.h
# Opt level: O0

bool __thiscall
Gudhi::Lazy_toplex_map::insert_simplex<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (Lazy_toplex_map *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range
          )

{
  unsigned_long *__args;
  bool bVar1;
  const_iterator __first;
  size_type sVar2;
  size_type sVar3;
  unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>
  *this_00;
  mapped_type *pmVar4;
  mapped_type *this_01;
  size_type sVar5;
  size_t sVar6;
  value_type *pvVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_false,_false>,_bool>
  pVar11;
  pair<int,_unsigned_long> pVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>,_false,_false>,_bool>
  pVar13;
  pair<std::__detail::_Node_iterator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true,_true>,_bool>
  pVar14;
  pair<unsigned_long,_unsigned_long> pVar15;
  unsigned_long local_168;
  pair<unsigned_long,_unsigned_long> local_160;
  handle_type local_150;
  _Node_iterator_base<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true>
  local_148;
  byte local_140;
  _Node_iterator_base<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true>
  local_138;
  byte local_130;
  _Node_iterator_base<std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>,_false>
  local_128;
  undefined1 local_120;
  int local_114;
  pair<int,_unsigned_long> local_110;
  pair<unsigned_long,_unsigned_long> local_100;
  node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>
  local_f0;
  handle_type v_handle;
  unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  local_d8;
  unsigned_long *local_98;
  Vertex *v;
  iterator __end2;
  iterator __begin2;
  Simplex *__range2;
  bool inserted;
  undefined1 local_68 [8];
  Simplex_ptr sptr;
  undefined1 local_48 [8];
  Simplex sigma;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range_local;
  Lazy_toplex_map *this_local;
  
  sigma._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)vertex_range;
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(vertex_range);
  sptr.
  super___shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  sigma._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  set<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)local_48,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )sptr.
               super___shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  sVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )local_48);
  this->empty_toplex = sVar2 == 0;
  std::
  make_shared<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>&>
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_68);
  __range2._3_1_ = false;
  __end2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)local_48);
  v = (Vertex *)
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_48);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&v);
    if (!bVar1) break;
    local_98 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&__end2);
    sVar3 = std::
            unordered_map<unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
            ::count(&this->t0,local_98);
    __args = local_98;
    if (sVar3 == 0) {
      local_d8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      local_d8._M_h._M_rehash_policy._4_4_ = 0;
      local_d8._M_h._M_rehash_policy._M_next_resize = 0;
      local_d8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_d8._M_h._M_element_count = 0;
      local_d8._M_h._M_buckets = (__buckets_ptr)0x0;
      local_d8._M_h._M_bucket_count = 0;
      local_d8._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::
      unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
      ::unordered_set(&local_d8);
      pVar11 = std::
               unordered_map<unsigned_long,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>>>
               ::
               emplace<unsigned_long_const&,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>
                         ((unordered_map<unsigned_long,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>>>
                           *)&this->t0,__args,&local_d8);
      v_handle.node_ =
           (marked_heap_node<std::pair<unsigned_long,_unsigned_long>_> *)
           pVar11.first.
           super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_false>
           ._M_cur;
      std::
      unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
      ::~unordered_set(&local_d8);
      local_114 = 0;
      pVar12 = std::make_pair<int,unsigned_long_const&>(&local_114,local_98);
      local_110.second = pVar12.second;
      local_110.first = pVar12.first;
      std::pair<unsigned_long,_unsigned_long>::pair<int,_unsigned_long,_true>(&local_100,&local_110)
      ;
      local_f0.node_ =
           (marked_heap_node<std::pair<unsigned_long,_unsigned_long>_> *)
           boost::heap::
           fibonacci_heap<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
           ::push(&this->cleaning_priority,&local_100);
      pVar13 = std::
               unordered_map<unsigned_long,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>>>>
               ::
               emplace<unsigned_long_const&,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>&>
                         ((unordered_map<unsigned_long,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>>>>
                           *)&this->cp_handles,local_98,&local_f0);
      local_128._M_cur =
           (__node_type *)
           pVar13.first.
           super__Node_iterator_base<std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>,_false>
           ._M_cur;
      local_120 = pVar13.second;
    }
    this_00 = (unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>
               *)std::
                 unordered_map<unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                 ::at(&this->t0,local_98);
    pVar14 = std::
             unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>
             ::
             emplace<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>&>
                       (this_00,(shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
                                 *)local_68);
    local_148._M_cur =
         (__node_type *)
         pVar14.first.
         super__Node_iterator_base<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true>
         ._M_cur;
    local_140 = pVar14.second;
    __range2._3_1_ = (bool)(local_140 & 1);
    local_138._M_cur = local_148._M_cur;
    local_130 = local_140;
    pmVar4 = std::
             unordered_map<unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>_>_>
             ::at(&this->cp_handles,local_98);
    local_150.node_ = pmVar4->node_;
    this_01 = std::
              unordered_map<unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
              ::at(&this->t0,local_98);
    sVar5 = std::
            unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
            ::size(this_01);
    sVar6 = get_gamma0_lbound(this,*local_98);
    local_168 = sVar5 - sVar6;
    pVar15 = std::make_pair<unsigned_long,unsigned_long_const&>(&local_168,local_98);
    local_160 = pVar15;
    boost::heap::
    fibonacci_heap<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
    ::update(&this->cleaning_priority,local_150,&local_160);
    std::_Rb_tree_const_iterator<unsigned_long>::operator++(&__end2);
  }
  if (__range2._3_1_ != false) {
    this->size = this->size + 1;
  }
  sVar6 = this->size;
  auVar9._8_4_ = (int)(sVar6 >> 0x20);
  auVar9._0_8_ = sVar6;
  auVar9._12_4_ = 0x45300000;
  lVar8 = this->size_lbound + 1;
  auVar10._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar10._0_8_ = lVar8;
  auVar10._12_4_ = 0x45300000;
  if (((auVar10._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) * this->BETTA <
      (auVar9._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) {
    pvVar7 = boost::heap::
             fibonacci_heap<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
             ::top(&this->cleaning_priority);
    clean(this,pvVar7->second);
  }
  std::
  shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>::
  ~shared_ptr((shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
               *)local_68);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_48);
  return __range2._3_1_;
}

Assistant:

bool Lazy_toplex_map::insert_simplex(const Input_vertex_range &vertex_range) {
  Simplex sigma(vertex_range.begin(), vertex_range.end());
  // Check empty face management
  empty_toplex = (sigma.size() == 0);
  Simplex_ptr sptr = std::make_shared<Simplex>(sigma);
  bool inserted = false;
  for (const Vertex &v : sigma) {
    if (!t0.count(v)) {
      t0.emplace(v, Simplex_ptr_set());
      auto v_handle = cleaning_priority.push(std::make_pair(0, v));
      cp_handles.emplace(v, v_handle);
    }
    inserted = t0.at(v).emplace(sptr).second;
    cleaning_priority.update(cp_handles.at(v), std::make_pair(t0.at(v).size() - get_gamma0_lbound(v), v));
  }
  if (inserted) size++;
  if (size > (size_lbound + 1) * BETTA) clean(cleaning_priority.top().second);
  return inserted;
}